

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O1

void __thiscall SQVM::Raise_CompareError(SQVM *this,SQObject *o1,SQObject *o2)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr oval2;
  SQObjectPtr oval1;
  SQObjectPtr local_40;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  local_40.super_SQObject._type = o1->_type;
  local_40.super_SQObject._unVal = (SQObjectValue)(o1->_unVal).pTable;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_20.super_SQObject._unVal.pString = PrintObjVal(this,&local_40);
  local_20.super_SQObject._type = OT_STRING;
  if (local_20.super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQObjectPtr::~SQObjectPtr(&local_40);
    local_30.super_SQObject._type = o2->_type;
    local_30.super_SQObject._unVal = (SQObjectValue)(o2->_unVal).pTable;
    if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    local_40.super_SQObject._unVal.pString = PrintObjVal(this,&local_30);
    local_40.super_SQObject._type = OT_STRING;
    if (local_40.super_SQObject._unVal.pTable != (SQTable *)0x0) {
      pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQObjectPtr::~SQObjectPtr(&local_30);
      Raise_Error(this,"comparison between \'%.50s\' and \'%.50s\'",
                  &(local_20.super_SQObject._unVal.pTable)->_firstfree,
                  &(local_40.super_SQObject._unVal.pTable)->_firstfree);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQObjectPtr::~SQObjectPtr(&local_20);
      return;
    }
  }
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.h"
                ,0xe9,"SQObjectPtr::SQObjectPtr(SQString *)");
}

Assistant:

void SQVM::Raise_CompareError(const SQObject &o1, const SQObject &o2)
{
    SQObjectPtr oval1 = PrintObjVal(o1), oval2 = PrintObjVal(o2);
    Raise_Error(_SC("comparison between '%.50s' and '%.50s'"), _stringval(oval1), _stringval(oval2));
}